

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

void __thiscall absl::uint128::uint128(uint128 *this,float v)

{
  uint128 uVar1;
  uint64_t local_28;
  uint64_t local_20;
  float v_local;
  uint128 *this_local;
  
  uVar1 = anon_unknown_2::MakeUint128FromFloat<float>(v);
  local_28 = uVar1.lo_;
  this->lo_ = local_28;
  local_20 = uVar1.hi_;
  this->hi_ = local_20;
  return;
}

Assistant:

uint128::uint128(float v) : uint128(MakeUint128FromFloat(v)) {}